

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_reaper.cc
# Opt level: O2

bool __thiscall
sptk::PitchExtractionByReaper::Get
          (PitchExtractionByReaper *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  double *pdVar1;
  pointer pdVar2;
  Polarity PVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  pointer psVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  int tmp;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> _Stack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  vector<float,_std::allocator<float>_> correlation;
  vector<short,_std::allocator<short>_> integer_waveform;
  EpochTracker epoch_tracker;
  
  if ((this->is_valid_ != true) ||
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    return false;
  }
  reaper::EpochTracker::EpochTracker(&epoch_tracker);
  epoch_tracker.unvoiced_cost_ = (float)this->voicing_threshold_;
  std::vector<short,_std::allocator<short>_>::vector
            (&integer_waveform,
             (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&tmp);
  pdVar1 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  psVar10 = integer_waveform.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pdVar7 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar7 != pdVar1; pdVar7 = pdVar7 + 1) {
    *psVar10 = (short)(int)*pdVar7;
    psVar10 = psVar10 + 1;
  }
  bVar4 = reaper::EpochTracker::Init
                    (&epoch_tracker,
                     integer_waveform.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (int32_t)((ulong)((long)integer_waveform.
                                             super__Vector_base<short,_std::allocator<short>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)integer_waveform.
                                            super__Vector_base<short,_std::allocator<short>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 1),
                     (float)this->sampling_rate_,(float)this->lower_f0_,(float)this->upper_f0_,true,
                     false);
  if (bVar4) {
    if (polarity != (Polarity *)0x0) {
      bVar4 = reaper::EpochTracker::ComputePolarity(&epoch_tracker,&tmp);
      if (!bVar4) goto LAB_0010631c;
      PVar3 = (uint)(tmp == -1) * 2;
      if (tmp == 1) {
        PVar3 = kPositive;
      }
      *polarity = PVar3;
    }
    bVar4 = true;
    if (f0 == (vector<double,_std::allocator<double>_> *)0x0 &&
        epochs == (vector<double,_std::allocator<double>_> *)0x0) goto LAB_0010631e;
    bVar5 = reaper::EpochTracker::ComputeFeatures(&epoch_tracker);
    if (bVar5) {
      bVar5 = reaper::EpochTracker::TrackEpochs(&epoch_tracker);
      std::__cxx11::string::string((string *)&tmp,"",(allocator *)&correlation);
      reaper::EpochTracker::WriteDiagnostics(&epoch_tracker,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      if (bVar5) {
        if (f0 != (vector<double,_std::allocator<double>_> *)0x0) {
          _tmp = (float *)0x0;
          _Stack_270._M_current = (float *)0x0;
          local_268._M_allocated_capacity = 0;
          correlation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          correlation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          correlation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar5 = reaper::EpochTracker::ResampleAndReturnResults
                            (&epoch_tracker,(float)this->frame_shift_ / (float)this->sampling_rate_,
                             (vector<float,_std::allocator<float>_> *)&tmp,&correlation);
          if (!bVar5) {
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&correlation.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&tmp);
            goto LAB_0010631c;
          }
          fVar14 = ceilf((float)(ulong)((long)(waveform->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(waveform->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data._M_start >> 3) /
                         (float)this->frame_shift_);
          iVar6 = (int)fVar14;
          if (iVar6 < (int)((ulong)((long)_Stack_270._M_current - (long)_tmp) >> 2)) {
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)&tmp,(long)iVar6);
          }
          std::vector<double,_std::allocator<double>_>::resize(f0,(long)iVar6);
          std::
          __copy_move_a<false,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (_tmp,_Stack_270,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start);
          std::__fill_a1<double*,float>
                    ((double *)
                     (((long)_Stack_270._M_current - (long)_tmp) * 2 +
                     (long)(f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start),
                     (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish,_Stack_270._M_current + -1);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&correlation.super__Vector_base<float,_std::allocator<float>_>);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&tmp);
        }
        if (epochs != (vector<double,_std::allocator<double>_> *)0x0) {
          _tmp = (float *)0x0;
          _Stack_270._M_current = (float *)0x0;
          local_268._M_allocated_capacity = 0;
          correlation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          correlation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          correlation.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          reaper::EpochTracker::GetFilledEpochs
                    (&epoch_tracker,0.01,(vector<float,_std::allocator<float>_> *)&tmp,
                     (vector<short,_std::allocator<short>_> *)&correlation);
          uVar12 = (ulong)((long)_Stack_270._M_current - (long)_tmp) >> 2;
          uVar8 = 0;
          uVar13 = uVar12 & 0xffffffff;
          if ((int)uVar12 < 1) {
            uVar13 = uVar8;
          }
          uVar9 = 0;
          for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            uVar9 = (uVar9 + 1) -
                    (uint)(*(short *)((long)correlation.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + uVar8 * 2) ==
                          0);
          }
          std::vector<double,_std::allocator<double>_>::resize(epochs,(ulong)uVar9);
          pdVar2 = (epochs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar6 = 0;
          for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            if (*(short *)((long)correlation.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar8 * 2) != 0) {
              lVar11 = (long)iVar6;
              iVar6 = iVar6 + 1;
              pdVar2[lVar11] = (double)*(_tmp + uVar8 * 4);
            }
          }
          std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                    ((_Vector_base<short,_std::allocator<short>_> *)&correlation);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&tmp);
        }
        goto LAB_0010631e;
      }
    }
  }
LAB_0010631c:
  bVar4 = false;
LAB_0010631e:
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&integer_waveform.super__Vector_base<short,_std::allocator<short>_>);
  reaper::EpochTracker::~EpochTracker(&epoch_tracker);
  return bVar4;
}

Assistant:

bool PitchExtractionByReaper::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  reaper::EpochTracker epoch_tracker;
  epoch_tracker.set_unvoiced_cost(static_cast<float>(voicing_threshold_));
  std::vector<int16_t> integer_waveform(waveform.size());
  std::transform(waveform.begin(), waveform.end(), integer_waveform.begin(),
                 [](double x) { return static_cast<int16_t>(x); });
  if (!epoch_tracker.Init(integer_waveform.data(),
                          static_cast<int32_t>(integer_waveform.size()),
                          static_cast<float>(sampling_rate_),
                          static_cast<float>(lower_f0_),
                          static_cast<float>(upper_f0_), true, false)) {
    return false;
  }

  if (NULL != polarity) {
    // ComputePolarity should be run before calling ComputeFeatures.
    int tmp;
    if (!epoch_tracker.ComputePolarity(&tmp)) {
      return false;
    }
    if (1 == tmp) {
      *polarity = PitchExtractionInterface::Polarity::kPositive;
    } else if (-1 == tmp) {
      *polarity = PitchExtractionInterface::Polarity::kNegative;
    } else {
      *polarity = PitchExtractionInterface::Polarity::kUnknown;
    }
  }

  if (NULL != f0 || NULL != epochs) {
    if (!epoch_tracker.ComputeFeatures()) {
      return false;
    }
    const bool track_result(epoch_tracker.TrackEpochs());
    epoch_tracker.WriteDiagnostics("");
    if (!track_result) {
      return false;
    }
  }

  if (NULL != f0) {
    const float external_frame_interval(static_cast<float>(frame_shift_) /
                                        static_cast<float>(sampling_rate_));
    std::vector<float> tmp_f0;
    std::vector<float> correlation;
    if (!epoch_tracker.ResampleAndReturnResults(external_frame_interval,
                                                &tmp_f0, &correlation)) {
      return false;
    }
    const int target_length(static_cast<int>(
        std::ceil(static_cast<float>(waveform.size()) / frame_shift_)));
    if (target_length < static_cast<int>(tmp_f0.size())) {
      tmp_f0.resize(target_length);
    }
    f0->resize(target_length);
    std::copy(tmp_f0.begin(), tmp_f0.end(), f0->begin());
    std::fill(f0->begin() + tmp_f0.size(), f0->end(), tmp_f0.back());
  }

  if (NULL != epochs) {
    std::vector<float> times;
    std::vector<int16_t> voicing;
    epoch_tracker.GetFilledEpochs(reaper::kUnvoicedPulseInterval, &times,
                                  &voicing);

    const int time_length(static_cast<int>(times.size()));
    int num_epochs(0);
    for (int i(0); i < time_length; ++i) {
      if (voicing[i]) ++num_epochs;
    }
    epochs->resize(num_epochs);
    double* output(&((*epochs)[0]));
    for (int i(0), j(0); i < time_length; ++i) {
      if (voicing[i]) output[j++] = times[i];
    }
  }

  return true;
}